

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O2

void API::insert_value(STMT *stmt)

{
  TableInfo *pTVar1;
  Addr p_00;
  bool bVar2;
  int pos;
  reference pvVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  Addr p;
  IndexInfo I;
  Addr local_1a0;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  string local_130;
  undefined1 local_110 [48];
  undefined1 local_e0 [72];
  IndexInfo local_98;
  
  std::__cxx11::string::string((string *)&local_130,(string *)&stmt->tableName);
  pos = catalog::existTable(&CM,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  bVar2 = checkInsert(stmt,pos);
  if (bVar2) {
    local_1a0.BlockNum = 0;
    local_1a0.FileOff = 0;
    STMT::STMT((STMT *)local_e0,stmt);
    RecordManager::InsertSuchRecord(&RM,(STMT *)local_e0,&local_1a0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
    pTVar1 = CM.TableInfoList.super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
             super__Vector_impl_data._M_start[pos];
    p_Var4 = (pTVar1->indexInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var4 != &(pTVar1->indexInfo)._M_t._M_impl.super__Rb_tree_header) {
      local_190._M_p = (pointer)&local_180;
      local_188 = 0;
      local_180._M_local_buf[0] = '\0';
      local_170._M_p = (pointer)&local_160;
      local_168 = 0;
      local_160._M_local_buf[0] = '\0';
      local_150._M_p = (pointer)&local_140;
      local_148 = 0;
      local_140._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&local_170);
      std::__cxx11::string::_M_assign((string *)&local_190);
      local_198._4_4_ =
           (pTVar1->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(int)p_Var4[1]._M_color];
      IndexInfo::IndexInfo(&local_98,(IndexInfo *)local_198);
      p_00 = local_1a0;
      pvVar3 = std::vector<value,_std::allocator<value>_>::at
                         (stmt->v_list,(long)(int)p_Var4[1]._M_color);
      value::value((value *)local_110,pvVar3);
      IndexManager::InsertSuchKey(&IM,&local_98,p_00,(value *)local_110);
      std::__cxx11::string::~string((string *)(local_110 + 8));
      IndexInfo::~IndexInfo(&local_98);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      IndexInfo::~IndexInfo((IndexInfo *)local_198);
    }
    printStatement(stmt);
  }
  return;
}

Assistant:

void API::insert_value(STMT *stmt){
    int pos = CM.existTable(stmt->tableName);
    if(!checkInsert(stmt,pos))return;
    //检查无误
    Addr p = {0,0};
    RM.InsertSuchRecord(*stmt,p);
    TableInfo* T = CM.TableInfoList[pos];
    std::map<int,std::string>::iterator it;
    it = T->indexInfo.begin();
    while(it != T->indexInfo.end())
    {
        IndexInfo I;
        I.tableName = stmt->tableName;
        I.indexName = it->second;
        I.type = T->type[it->first];
        //插入B+树
        IM.InsertSuchKey(I,p,stmt->v_list->at(it->first));
        it ++;
    }
    printStatement(stmt);
}